

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

uint8_t message_color(uint16_t age)

{
  uint8_t uVar1;
  message_t *pmVar2;
  message_t *m;
  uint16_t age_local;
  
  pmVar2 = message_get(age);
  if (pmVar2 == (message_t *)0x0) {
    uVar1 = '\x01';
  }
  else {
    uVar1 = message_type_color(pmVar2->type);
  }
  return uVar1;
}

Assistant:

uint8_t message_color(uint16_t age)
{
	message_t *m = message_get(age);
	return (m ? message_type_color(m->type) : COLOUR_WHITE);
}